

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenAtomicCmpxchgSetExpected(BinaryenExpressionRef expr,BinaryenExpressionRef expectedExpr)

{
  if (expr->_id != AtomicCmpxchgId) {
    __assert_fail("expression->is<AtomicCmpxchg>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xbe0,
                  "void BinaryenAtomicCmpxchgSetExpected(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (expectedExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)expectedExpr;
    return;
  }
  __assert_fail("expectedExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xbe1,
                "void BinaryenAtomicCmpxchgSetExpected(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenAtomicCmpxchgSetExpected(BinaryenExpressionRef expr,
                                      BinaryenExpressionRef expectedExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicCmpxchg>());
  assert(expectedExpr);
  static_cast<AtomicCmpxchg*>(expression)->expected = (Expression*)expectedExpr;
}